

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalNinjaGenerator::MakeCustomLauncher_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,cmCustomCommandGenerator *ccg)

{
  cmMakefile *this_00;
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  const_reference source;
  ulong uVar4;
  string local_1c0;
  string local_1a0;
  RelativeRoot local_17c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_178;
  RelativeRoot relative_root;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  string output;
  RuleVariables vars;
  allocator local_51;
  string local_50;
  char *local_30;
  char *property_value;
  char *property;
  cmCustomCommandGenerator *ccg_local;
  cmLocalNinjaGenerator *this_local;
  string *launcher;
  
  property_value = "RULE_LAUNCH_CUSTOM";
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  property = (char *)ccg;
  ccg_local = (cmCustomCommandGenerator *)this;
  this_local = (cmLocalNinjaGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"RULE_LAUNCH_CUSTOM",&local_51);
  pcVar3 = cmMakefile::GetProperty(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_30 = pcVar3;
  if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    cmLocalGenerator::RuleVariables::RuleVariables((RuleVariables *)((long)&output.field_2 + 8));
    std::__cxx11::string::string((string *)&outputs);
    pvStack_178 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                            ((cmCustomCommandGenerator *)property);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(pvStack_178);
    if (!bVar1) {
      cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_
                (&local_1a0,(cmCustomCommandGenerator *)property);
      bVar2 = std::__cxx11::string::empty();
      std::__cxx11::string::~string((string *)&local_1a0);
      local_17c = (uint)bVar2 + (uint)bVar2 * 4;
      source = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_178,0);
      cmOutputConverter::Convert
                (&local_1c0,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,source,local_17c,SHELL);
      std::__cxx11::string::operator=((string *)&outputs,(string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
    }
    std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    ExpandRuleVariables(this,__return_storage_ptr__,(RuleVariables *)((long)&output.field_2 + 8));
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
    }
    std::__cxx11::string::~string((string *)&outputs);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::MakeCustomLauncher(
  cmCustomCommandGenerator const& ccg)
{
  const char* property = "RULE_LAUNCH_CUSTOM";
  const char* property_value = this->Makefile->GetProperty(property);

  if(!property_value || !*property_value)
  {
    return std::string();
  }

  // Expand rules in the empty string.  It may insert the launcher and
  // perform replacements.
  RuleVariables vars;
  vars.RuleLauncher = property;
  std::string output;
  const std::vector<std::string>& outputs = ccg.GetOutputs();
  if(!outputs.empty())
  {
    RelativeRoot relative_root =
      ccg.GetWorkingDirectory().empty() ? START_OUTPUT : NONE;

    output = this->Convert(outputs[0], relative_root, SHELL);
  }
  vars.Output = output.c_str();

  std::string launcher;
  this->ExpandRuleVariables(launcher, vars);
  if(!launcher.empty())
  {
    launcher += " ";
  }

  return launcher;
}